

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

void __thiscall pbrt::MLTSampler::EnsureReady(MLTSampler *this,int index)

{
  PrimarySample *pPVar1;
  PrimarySample *pPVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  Float FVar6;
  float fVar7;
  undefined1 auVar9 [16];
  float fVar8;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 in_register_00001304 [12];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  uVar5 = (ulong)index;
  if ((this->X).nStored <= uVar5) {
    pstd::
    vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
    ::resize(&this->X,(long)(index + 1));
  }
  pPVar2 = (this->X).ptr;
  pPVar1 = pPVar2 + uVar5;
  lVar4 = pPVar2[uVar5].lastModificationIteration;
  if (lVar4 < this->lastLargeStepIteration) {
    FVar6 = RNG::Uniform<float>(&this->rng);
    pPVar1->value = FVar6;
    lVar4 = this->lastLargeStepIteration;
    pPVar1->lastModificationIteration = lVar4;
  }
  else {
    FVar6 = pPVar1->value;
  }
  pPVar1->valueBackup = FVar6;
  pPVar1->modifyBackup = lVar4;
  if (this->largeStep == true) {
    fVar7 = RNG::Uniform<float>(&this->rng);
  }
  else {
    lVar3 = this->currentIteration;
    auVar10._0_4_ = RNG::Uniform<float>(&this->rng);
    auVar10._4_60_ = extraout_var;
    auVar12 = vfmadd213ss_fma(auVar10._0_16_,SUB6416(ZEXT464(0x40000000),0),ZEXT416(0xbf800000));
    auVar11._0_4_ = ErfInv(auVar12._0_4_);
    auVar11._4_60_ = extraout_var_00;
    auVar12 = vfmadd132ss_fma(auVar11._0_16_,ZEXT816(0) << 0x40,ZEXT416(0x3fb504f3));
    fVar7 = this->sigma;
    auVar9._0_4_ = (float)(lVar3 - lVar4);
    auVar9._4_12_ = in_register_00001304;
    if (auVar9._0_4_ < 0.0) {
      fVar8 = sqrtf(auVar9._0_4_);
      auVar12 = ZEXT416(auVar12._0_4_);
    }
    else {
      auVar9 = vsqrtss_avx(auVar9,auVar9);
      fVar8 = auVar9._0_4_;
    }
    auVar9 = vfmadd213ss_fma(ZEXT416((uint)(fVar7 * fVar8)),auVar12,ZEXT416((uint)pPVar1->value));
    auVar12 = vroundss_avx(auVar9,auVar9,9);
    fVar7 = auVar9._0_4_ - auVar12._0_4_;
  }
  pPVar1->value = fVar7;
  pPVar1->lastModificationIteration = this->currentIteration;
  return;
}

Assistant:

void MLTSampler::EnsureReady(int index) {
#ifdef PBRT_IS_GPU_CODE
    LOG_FATAL("MLTSampler not supported on GPU--needs vector resize...");
    return;
#else
    // Enlarge _MLTSampler::X_ if necessary and get current $\VEC{X}_i$
    if (index >= X.size())
        X.resize(index + 1);
    PrimarySample &Xi = X[index];

    // Reset $\VEC{X}_i$ if a large step took place in the meantime
    if (Xi.lastModificationIteration < lastLargeStepIteration) {
        Xi.value = rng.Uniform<Float>();
        Xi.lastModificationIteration = lastLargeStepIteration;
    }

    // Apply remaining sequence of mutations to _sample_
    Xi.Backup();
    if (largeStep) {
        Xi.value = rng.Uniform<Float>();
    } else {
        int64_t nSmall = currentIteration - Xi.lastModificationIteration;
        // Apply _nSmall_ small step mutations
        // Sample the standard normal distribution $N(0, 1)$
        Float normalSample = SampleNormal(rng.Uniform<Float>());

        // Compute the effective standard deviation and apply perturbation to $\VEC{X}_i$
        Float effSigma = sigma * std::sqrt((Float)nSmall);
        Xi.value += normalSample * effSigma;
        Xi.value -= std::floor(Xi.value);
    }
    Xi.lastModificationIteration = currentIteration;

#endif
}